

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestSubmitHandler.cxx
# Opt level: O0

int __thiscall cmCTestSubmitHandler::GetSubmitInactivityTimeout(cmCTestSubmitHandler *this)

{
  cmCTest *pcVar1;
  int iVar2;
  bool bVar3;
  ulong uVar4;
  ostream *poVar5;
  basic_ostream<char,_std::char_traits<char>_> *pbVar6;
  char *msg;
  _Quoted_string<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_char>
  _Var7;
  string local_238 [32];
  _Quoted_string<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_char>
  local_218;
  _Quoted_string<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_char>
  local_208;
  undefined1 local_1f8 [8];
  ostringstream cmCTestLog_msg;
  int local_80 [2];
  unsigned_long timeout;
  allocator<char> local_61;
  string local_60;
  string local_40;
  string *local_20;
  string *timeoutStr;
  cmCTestSubmitHandler *pcStack_10;
  int submitInactivityTimeout;
  cmCTestSubmitHandler *this_local;
  
  timeoutStr._4_4_ = 0x78;
  pcVar1 = (this->super_cmCTestGenericHandler).CTest;
  pcStack_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,"SubmitInactivityTimeout",&local_61);
  cmCTest::GetCTestConfiguration(&local_40,pcVar1,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator(&local_61);
  local_20 = &local_40;
  uVar4 = std::__cxx11::string::empty();
  _Var7._M_delim = local_218._M_delim;
  _Var7._M_escape = local_218._M_escape;
  _Var7._10_6_ = local_218._10_6_;
  _Var7._M_string = local_218._M_string;
  if ((uVar4 & 1) == 0) {
    bVar3 = cmStrToULong(local_20,(unsigned_long *)local_80);
    _Var7._M_delim = local_218._M_delim;
    _Var7._M_escape = local_218._M_escape;
    _Var7._10_6_ = local_218._10_6_;
    _Var7._M_string = local_218._M_string;
    if (bVar3) {
      timeoutStr._4_4_ = local_80[0];
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1f8);
      poVar5 = std::operator<<((ostream *)local_1f8,"SubmitInactivityTimeout is invalid: ");
      _Var7 = std::quoted<char,std::char_traits<char>,std::allocator<char>>(local_20,'\"','\\');
      local_208._M_string = _Var7._M_string;
      local_218._8_2_ = _Var7._8_2_;
      local_208._M_delim = local_218._M_delim;
      local_208._M_escape = local_218._M_escape;
      local_218 = _Var7;
      pbVar6 = std::__detail::operator<<(poVar5,&local_208);
      poVar5 = std::operator<<(pbVar6,".");
      poVar5 = std::operator<<(poVar5," Using a default value of ");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x78);
      poVar5 = std::operator<<(poVar5,".");
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      pcVar1 = (this->super_cmCTestGenericHandler).CTest;
      std::__cxx11::ostringstream::str();
      msg = (char *)std::__cxx11::string::c_str();
      cmCTest::Log(pcVar1,7,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestSubmitHandler.cxx"
                   ,0x394,msg,false);
      std::__cxx11::string::~string(local_238);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1f8);
      _Var7 = local_218;
    }
  }
  iVar2 = timeoutStr._4_4_;
  local_218 = _Var7;
  std::__cxx11::string::~string((string *)&local_40);
  return iVar2;
}

Assistant:

int cmCTestSubmitHandler::GetSubmitInactivityTimeout()
{
  int submitInactivityTimeout = SUBMIT_TIMEOUT_IN_SECONDS_DEFAULT;
  std::string const& timeoutStr =
    this->CTest->GetCTestConfiguration("SubmitInactivityTimeout");
  if (!timeoutStr.empty()) {
    unsigned long timeout;
    if (cmStrToULong(timeoutStr, &timeout)) {
      submitInactivityTimeout = static_cast<int>(timeout);
    } else {
      cmCTestLog(this->CTest, ERROR_MESSAGE,
                 "SubmitInactivityTimeout is invalid: "
                   << cm::quoted(timeoutStr) << "."
                   << " Using a default value of "
                   << SUBMIT_TIMEOUT_IN_SECONDS_DEFAULT << "." << std::endl);
    }
  }
  return submitInactivityTimeout;
}